

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall clask::server_t::run(server_t *this,string *addr)

{
  int port_00;
  long lVar1;
  runtime_error *this_00;
  string local_78;
  int local_54;
  undefined1 local_50 [4];
  int port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> host;
  size_type pos;
  string *addr_local;
  server_t *this_local;
  
  lVar1 = std::__cxx11::string::find_last_of((char)addr,0x3a);
  if (lVar1 == -1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid host:port");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)addr);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)addr);
  port_00 = std::__cxx11::stoi(&local_78,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_78);
  local_54 = port_00;
  _run(this,(string *)local_50,port_00);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

inline void server_t::run(const std::string& addr) {
  auto pos = addr.find_last_of(':');
  if (pos == std::string::npos) {
    throw std::runtime_error("invalid host:port");
  }
  auto host = addr.substr(0, pos);
  auto port = std::stoi(addr.substr(pos + 1));
  _run(host, port);
}